

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O0

bool __thiscall bssl::der::ParseVisibleString(der *this,Input in,string *out)

{
  size_t extraout_RDX;
  Span<const_unsigned_char> b;
  bssl *local_68;
  uchar *local_60;
  string_view local_58;
  byte local_41;
  iterator puStack_40;
  uint8_t c;
  iterator __end2;
  iterator __begin2;
  Input *__range2;
  string *out_local;
  Input in_local;
  
  __range2 = (Input *)in.data_.size_;
  in_local.data_.data_ = in.data_.data_;
  __begin2 = (iterator)&out_local;
  out_local = (string *)this;
  __end2 = Input::begin((Input *)__begin2);
  puStack_40 = Input::end((Input *)__begin2);
  while( true ) {
    if (__end2 == puStack_40) {
      Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
                ((Span<unsigned_char_const> *)&local_68,(Input *)&out_local);
      b.size_ = extraout_RDX;
      b.data_ = local_60;
      local_58 = BytesAsStringView(local_68,b);
      ::std::__cxx11::string::operator=((string *)__range2,&local_58);
      return true;
    }
    local_41 = *__end2;
    if ((local_41 < 0x20) || (0x7e < local_41)) break;
    __end2 = __end2 + 1;
  }
  return false;
}

Assistant:

bool ParseVisibleString(Input in, std::string *out) {
  // ITU-T X.680:
  // VisibleString : "Defining registration number 6" + SPACE
  // 6 includes all the characters from '!' .. '~' (33 .. 126), space is 32.
  // Also ITU-T X.691 says it much more clearly:
  // "for VisibleString [the range] is 32 to 126 ... For VisibleString .. all
  // the values in the range are present."
  for (uint8_t c : in) {
    if (c < 32 || c > 126) {
      return false;
    }
  }
  *out = BytesAsStringView(in);
  return true;
}